

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

mp_int * rsa_privkey_op(mp_int *input,RSAKey *key)

{
  mp_int *pmVar1;
  RSAKey *key_local;
  mp_int *input_local;
  
  pmVar1 = crt_modpow(input,key->private_exponent,key->modulus,key->p,key->q,key->iqmp);
  return pmVar1;
}

Assistant:

static mp_int *rsa_privkey_op(mp_int *input, RSAKey *key)
{
    return crt_modpow(input, key->private_exponent,
                      key->modulus, key->p, key->q, key->iqmp);
}